

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

string * format::strip_name(string *__return_storage_ptr__,string *name)

{
  std::__cxx11::string::rfind((char *)name,0x14f5bc,0xffffffffffffffff);
  std::__cxx11::string::rfind((char *)name,0x1500b2,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)name);
  return __return_storage_ptr__;
}

Assistant:

std::string strip_name(std::string name){
  auto p1 = name.rfind("/");
  auto p2 = name.rfind(".");
  std::string slide = name.substr( p1 != std::string::npos ? p1+1 : 0,
                                   p2 != std::string::npos ? p2-p1-1 : std::string::npos);
  return slide;
 }